

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<float>::AddSub
          (TPZMatrix<float> *this,int64_t sRow,int64_t sCol,int64_t rowSize,int64_t colSize,
          int64_t pRow,int64_t pCol,TPZMatrix<float> *pA)

{
  long lVar1;
  int64_t iVar2;
  int64_t iVar3;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float local_54;
  long local_50;
  long local_48;
  int64_t local_40;
  long local_38;
  
  local_48 = pRow + rowSize;
  local_40 = sCol;
  if (((pA->super_TPZBaseMatrix).fRow < local_48) ||
     ((pA->super_TPZBaseMatrix).fCol < colSize + pCol)) {
    Error("AddSub <the sub-matrix is too big that target>",(char *)0x0);
  }
  if (0 < rowSize) {
    local_38 = colSize + pCol;
    do {
      iVar2 = pCol;
      iVar3 = local_40;
      local_50 = pRow;
      if (0 < colSize) {
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,sRow,iVar3);
          lVar1 = local_50;
          (*(pA->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(pA,local_50,iVar2);
          local_54 = extraout_XMM0_Da_00 + extraout_XMM0_Da;
          (*(pA->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (pA,lVar1,iVar2,&local_54);
          iVar2 = iVar2 + 1;
          iVar3 = iVar3 + 1;
        } while (iVar2 < local_38);
      }
      pRow = local_50 + 1;
      sRow = sRow + 1;
    } while (pRow < local_48);
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::AddSub(const int64_t sRow, const int64_t sCol, const int64_t rowSize,
							const int64_t colSize,const int64_t pRow,const int64_t pCol, TPZMatrix<TVar> *pA ) const {
    if ( ((pRow + rowSize) > pA->Rows()) || ((pCol + colSize) > pA->Cols())) {
        Error( "AddSub <the sub-matrix is too big that target>" );
    }
    int64_t NewRowSize = rowSize+pRow;
    int64_t NewColSize = colSize+pCol;
	
    int64_t row = sRow;
    for ( int64_t r = pRow; r < NewRowSize; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = pCol ; c < NewColSize; c++, col++ ) {
            pA->PutVal( r, c, GetVal( row, col )+pA->GetVal(r,c));
        }
    }
    return( 1 );
}